

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d59_q0_vector_swap.cpp
# Opt level: O2

int main(void)

{
  pointer piVar1;
  istream *piVar2;
  ostream *poVar3;
  int i;
  int iVar4;
  int *x;
  pointer piVar5;
  int n;
  int e2;
  int s2;
  int e1;
  int s1;
  int c;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::istream::operator>>((istream *)&std::cin,&local_80);
  for (iVar4 = 0; iVar4 < local_80; iVar4 = iVar4 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_6c);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_48,&local_6c);
  }
  std::istream::operator>>((istream *)&std::cin,&local_80);
  for (iVar4 = 0; iVar4 < local_80; iVar4 = iVar4 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_6c);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_68,&local_6c);
  }
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_70);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&local_74);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&local_78);
  std::istream::operator>>(piVar2,&local_7c);
  vector_swap((vector<int,_std::allocator<int>_> *)&local_48,
              (vector<int,_std::allocator<int>_> *)&local_68,local_70,local_74,local_78,local_7c);
  poVar3 = std::operator<<((ostream *)&std::cout,"v1 has ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  piVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
  for (piVar5 = local_48._M_impl.super__Vector_impl_data._M_start; piVar5 != piVar1;
      piVar5 = piVar5 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"v2 has ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  piVar1 = local_68._M_impl.super__Vector_impl_data._M_finish;
  for (piVar5 = local_68._M_impl.super__Vector_impl_data._M_start; piVar5 != piVar1;
      piVar5 = piVar5 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return 0;
}

Assistant:

int main() {
    // read input
    int n, c;
    vector<int> v1, v2;
    cin >> n; // number of v1
    for (int i = 0; i < n; i++) {
        cin >> c;
        v1.push_back(c);
    }
    cin >> n; // number of v2
    for (int i = 0; i < n; i++) {
        cin >> c;
        v2.push_back(c);
    }
    int s1, e1, s2, e2; // position
    cin >> s1 >> e1 >> s2 >> e2;
    // call the function
    vector_swap(v1, v2, s1, e1, s2, e2);
    // display content of the stack
    cout << "v1 has " << v1.size() << endl;
    for (auto &x : v1) {
        cout << x << " ";
    }
    cout << endl;
    // display content of the stack
    cout << "v2 has " << v2.size() << endl;
    for (auto &x : v2) {
        cout << x << " ";
    }
    cout << endl;
}